

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O0

void __thiscall OpenMD::AtomType::setMass(AtomType *this,RealType m)

{
  mapped_type_conflict1 *pmVar1;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  key_type *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *pmVar1 = true;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  *(undefined8 *)(in_RDI + 0x10) = in_XMM0_Qa;
  return;
}

Assistant:

void AtomType::setMass(RealType m) {
    myResponsibilities_["mass"] = true;
    mass_                       = m;
  }